

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPFForceManager.hpp
# Opt level: O3

double __thiscall
OpenMD::RNEMD::SPFForceManager::linearCombination<double>
          (SPFForceManager *this,double quantityA,double quantityB)

{
  double dVar1;
  double dVar2;
  long local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  Snapshot::getSPFData(this->currentSnapshot_);
  dVar1 = pow(*(double *)(local_20 + 0x18),(double)this->k_);
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  dVar2 = 1.0;
  if (dVar1 <= 1.0) {
    dVar2 = dVar1;
  }
  dVar2 = (double)(~-(ulong)(dVar1 < 0.0) & (ulong)dVar2);
  return (1.0 - dVar2) * quantityA + dVar2 * quantityB;
}

Assistant:

T linearCombination(T quantityA, T quantityB) {
      RealType result = f_lambda(currentSnapshot_->getSPFData()->lambda);

      return T {(1.0 - result) * quantityA + result * quantityB};
    }